

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O0

LocalSet * __thiscall wasm::Builder::makeLocalSet(Builder *this,Index index,Expression *value)

{
  LocalSet *this_00;
  LocalSet *ret;
  Expression *value_local;
  Index index_local;
  Builder *this_local;
  
  this_00 = MixedArena::alloc<wasm::LocalSet>(&this->wasm->allocator);
  this_00->index = index;
  this_00->value = value;
  LocalSet::makeSet(this_00);
  LocalSet::finalize(this_00);
  return this_00;
}

Assistant:

LocalSet* makeLocalSet(Index index, Expression* value) {
    auto* ret = wasm.allocator.alloc<LocalSet>();
    ret->index = index;
    ret->value = value;
    ret->makeSet();
    ret->finalize();
    return ret;
  }